

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  ID *__k;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  _Hash_node_base *p_Var8;
  long *plVar9;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  undefined7 in_register_00000011;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  char *__end;
  __hashtable *__h_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  ParsedIR *this_00;
  ulong uVar19;
  uint32_t alignment;
  string buffer_name;
  string decorations;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  __node_gen_type __node_gen;
  uint local_12f4;
  key_type local_12f0;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_12d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  undefined1 local_12a8 [64];
  string local_1268;
  undefined1 local_1248 [16];
  undefined1 local_1238 [272];
  undefined1 local_1128 [8];
  ID IStack_1120;
  undefined4 uStack_111c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  uint *local_1108;
  size_t sStack_1100;
  size_t local_10f8;
  uint local_10f0 [8];
  bool *local_10d0;
  size_t sStack_10c8;
  size_t local_10c0;
  bool local_10b8 [8];
  uint32_t local_10b0;
  char local_10ac [4];
  StorageClass local_10a8;
  undefined1 local_10a0 [56];
  uint *local_1068;
  size_t sStack_1060;
  size_t local_1058;
  uint local_1050 [8];
  undefined1 local_1030 [28];
  TypeID local_1014;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1010 [68];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      type_id);
  local_12f0._M_dataplus._M_p = (pointer)&local_12f0.field_2;
  local_12f0._M_string_length = 0;
  local_12f0.field_2._M_local_buf[0] = '\0';
  if (((int)CONCAT71(in_register_00000011,forward_declaration) == 0) ||
     (bVar3 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5), !bVar3))
  {
    psVar10 = (string *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5);
    ::std::__cxx11::string::operator=((string *)&local_12f0,(string *)local_1128);
    if (local_1128 != (undefined1  [8])&local_1118) {
      operator_delete((void *)local_1128);
    }
  }
  else {
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (local_1128,this,(ulong)(pSVar5->super_IVariant).self.id);
    __k = &(pSVar5->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&local_12f0,(string *)local_1128);
    if (local_1128 != (undefined1  [8])&local_1118) {
      operator_delete((void *)local_1128);
    }
    local_12d0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_12d0,__k);
    if ((((pmVar6->decoration).alias._M_string_length == 0) ||
        (iVar7 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->block_ssbo_names)._M_h,&local_12f0),
        iVar7.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->resource_names)._M_h,&local_12f0),
       iVar7.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x2f4e20,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_12f0,(string *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
    }
    variables_primary = &this->block_ssbo_names;
    psVar10 = &local_12f0;
    add_variable(this,variables_primary,&this->resource_names,psVar10);
    if (local_12f0._M_string_length == 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x2f4e20,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)psVar10);
      ::std::__cxx11::string::operator=((string *)&local_12f0,(string *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
    }
    local_1128 = (undefined1  [8])&this->block_names;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1128,&local_12f0);
    local_1128 = (undefined1  [8])variables_primary;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)variables_primary,&local_12f0);
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_12d0,__k);
    ::std::__cxx11::string::_M_assign((string *)pmVar6);
  }
  if (forward_declaration) {
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12f0,
               (char (*) [2])0x313c50);
  }
  else {
    uVar19 = (this->super_Compiler).physical_storage_type_to_alignment._M_h._M_bucket_count;
    psVar13 = (string *)((ulong)type_id % uVar19);
    p_Var15 = (this->super_Compiler).physical_storage_type_to_alignment._M_h._M_buckets
              [(long)psVar13];
    p_Var16 = (__node_base_ptr)0x0;
    if ((p_Var15 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var15->_M_nxt, p_Var16 = p_Var15,
       *(uint32_t *)&p_Var15->_M_nxt[1]._M_nxt != type_id)) {
      while (p_Var15 = p_Var8, p_Var8 = p_Var15->_M_nxt, psVar10 = psVar13,
            p_Var8 != (_Hash_node_base *)0x0) {
        p_Var16 = (__node_base_ptr)0x0;
        if (((string *)((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar19) != psVar13) ||
           (p_Var16 = p_Var15, *(uint *)&p_Var8[1]._M_nxt == type_id)) goto LAB_00256d9e;
      }
      p_Var16 = (__node_base_ptr)0x0;
    }
LAB_00256d9e:
    if (p_Var16 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var16->_M_nxt;
    }
    local_12f4 = 0;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      local_12f4 = *(uint *)((long)&p_Var8[1]._M_nxt + 4);
    }
    bVar3 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
    if (bVar3) {
      local_1248._0_8_ = local_1238 + 8;
      local_1248._8_8_ = 0;
      local_1238._0_8_ = (pointer)0x8;
      local_1128 = (undefined1  [8])&local_1118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"buffer_reference","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
      if (local_12f4 != 0) {
        join<char_const(&)[26],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)0x30cfd0,(char (*) [26])&local_12f4,
                   (uint *)psVar10);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1248,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if (local_1128 != (undefined1  [8])&local_1118) {
          operator_delete((void *)local_1128);
        }
      }
      buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,pSVar5,true,true);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
      ParsedIR::get_buffer_block_type_flags((Bitset *)local_12a8,&(this->super_Compiler).ir,pSVar5);
      paVar11 = &local_12c8.field_2;
      local_12c8._M_string_length = 0;
      local_12c8.field_2._M_local_buf[0] = '\0';
      local_12c8._M_dataplus._M_p = (pointer)paVar11;
      if ((local_12a8._0_8_ & 0x80000) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_12a8._0_8_ & 0x800000) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_12a8._0_8_ & 0x2000000) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_12a8._0_8_ & 0x1000000) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      local_110 = local_f8;
      local_1128 = (undefined1  [8])0x0;
      IStack_1120.id = 0;
      uStack_111c = 0;
      local_1118._M_allocated_capacity._0_4_ = 0;
      local_1118._M_allocated_capacity._4_4_ = 0;
      sStack_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1248._8_8_ != 0) {
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1248._0_8_ + local_1248._8_8_ * 0x20);
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1248._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar17->_M_dataplus)._M_p,
                     pbVar17->_M_string_length);
          if (pbVar17 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1248._0_8_ + local_1248._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 != pbVar14);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1268,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                (this,(char (*) [8])"layout(",&local_1268,(char (*) [2])0x314a82,&local_12c8,
                 (char (*) [9])0x30d009,&local_12f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
        operator_delete(local_1268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12c8._M_dataplus._M_p != paVar11) {
        operator_delete(local_12c8._M_dataplus._M_p);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_12a8 + 8));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1248);
    }
    else {
      local_1248._8_8_ = 0;
      local_1238._0_8_ = local_1238._0_8_ & 0xffffffffffffff00;
      local_1248._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1238;
      if (pSVar5->basetype == Struct) {
        buffer_to_packing_standard_abi_cxx11_((string *)local_12a8,this,pSVar5,true,false);
        plVar9 = (long *)::std::__cxx11::string::append(local_12a8);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar11) {
          local_1118._M_allocated_capacity._0_4_ = (undefined4)paVar11->_M_allocated_capacity;
          local_1118._M_allocated_capacity._4_4_ =
               (undefined4)(paVar11->_M_allocated_capacity >> 0x20);
          local_1118._8_4_ = (undefined4)plVar9[3];
          local_1118._12_4_ = (undefined4)((ulong)plVar9[3] >> 0x20);
          local_1128 = (undefined1  [8])&local_1118;
        }
        else {
          local_1118._M_allocated_capacity._0_4_ = (undefined4)paVar11->_M_allocated_capacity;
          local_1118._M_allocated_capacity._4_4_ =
               (undefined4)(paVar11->_M_allocated_capacity >> 0x20);
          local_1128 = (undefined1  [8])*plVar9;
        }
        IStack_1120.id = (uint32_t)plVar9[1];
        uStack_111c = (undefined4)((ulong)plVar9[1] >> 0x20);
        *plVar9 = (long)paVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_1248,(string *)local_1128);
        if (local_1128 != (undefined1  [8])&local_1118) {
          operator_delete((void *)local_1128);
        }
        if ((undefined1 *)local_12a8._0_8_ != local_12a8 + 0x10) {
          operator_delete((void *)local_12a8._0_8_);
        }
      }
      else {
        type = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
        bVar3 = Compiler::is_array(&this->super_Compiler,type);
        if (bVar3) {
          local_1108 = local_10f0;
          IStack_1120.id = 0;
          local_1128 = (undefined1  [8])&PTR__SPIRType_003a8f58;
          uStack_111c = 0x1e;
          local_1118._M_allocated_capacity._0_4_ = 0;
          local_1118._M_allocated_capacity._4_4_ = 0;
          local_1118._8_4_ = 1;
          local_1118._12_4_ = 1;
          sStack_1100 = 0;
          local_10f8 = 8;
          local_10d0 = local_10b8;
          sStack_10c8 = 0;
          local_10c0 = 8;
          local_10b0 = 0;
          local_10ac[0] = '\0';
          local_10ac[1] = '\0';
          local_10a8 = StorageClassGeneric;
          local_10a0._0_8_ = local_10a0 + 0x18;
          local_10a0._8_8_ = 0;
          local_10a0._16_8_ = 8;
          local_1068 = local_1050;
          sStack_1060 = 0;
          local_1058 = 8;
          local_1010[0]._M_buckets = &local_1010[0]._M_single_bucket;
          local_1030._0_7_ = 0;
          local_1030._7_4_ = 0;
          local_1014.id = 0;
          local_1030._12_4_ = 0;
          local_1030._16_4_ = ImageFormatUnknown;
          local_1030[0x14] = '\0';
          local_1030[0x15] = '\0';
          local_1030[0x16] = '\0';
          local_1030[0x17] = '\0';
          local_1030[0x18] = '\0';
          local_1030[0x19] = '\0';
          local_1030[0x1a] = '\0';
          local_1030[0x1b] = '\0';
          local_1010[0]._M_bucket_count = 1;
          local_1010[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1010[0]._M_element_count = 0;
          local_1010[0]._M_rehash_policy._M_max_load_factor = 1.0;
          local_1010[0]._M_rehash_policy._M_next_resize = 0;
          local_1010[0]._M_single_bucket = (__node_base_ptr)0x0;
          this_00 = &(this->super_Compiler).ir;
          IStack_1120.id = ParsedIR::increase_bound_by(this_00,1);
          uVar4 = Compiler::get_pointee_type_id(&this->super_Compiler,type_id);
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_10a0,
                     local_10a0._8_8_ + 1);
          ((TypedID<(spirv_cross::Types)1> *)(local_10a0._0_8_ + local_10a0._8_8_ * 4))->id = uVar4;
          local_10a0._8_8_ = local_10a0._8_8_ + 1;
          ParsedIR::set_member_decoration(this_00,(TypeID)IStack_1120.id,0,DecorationOffset,0);
          buffer_to_packing_standard_abi_cxx11_(&local_12c8,this,(SPIRType *)local_1128,true,false);
          plVar9 = (long *)::std::__cxx11::string::append((char *)&local_12c8);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar12) {
            local_12a8._16_8_ = *psVar12;
            local_12a8._24_8_ = plVar9[3];
            local_12a8._0_8_ = local_12a8 + 0x10;
          }
          else {
            local_12a8._16_8_ = *psVar12;
            local_12a8._0_8_ = (size_type *)*plVar9;
          }
          local_12a8._8_8_ = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)local_1248,(string *)local_12a8);
          if ((undefined1 *)local_12a8._0_8_ != local_12a8 + 0x10) {
            operator_delete((void *)local_12a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
            operator_delete(local_12c8._M_dataplus._M_p);
          }
          local_1128 = (undefined1  [8])&PTR__SPIRType_003a8f58;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(local_1010);
          sStack_1060 = 0;
          if (local_1068 != local_1050) {
            free(local_1068);
          }
          local_10a0._8_8_ = 0;
          if ((TypedID<(spirv_cross::Types)1> *)local_10a0._0_8_ !=
              (TypedID<(spirv_cross::Types)1> *)(local_10a0 + 0x18)) {
            free((void *)local_10a0._0_8_);
          }
          sStack_10c8 = 0;
          if (local_10d0 != local_10b8) {
            free(local_10d0);
          }
          sStack_1100 = 0;
          if (local_1108 != local_10f0) {
            free(local_1108);
          }
        }
      }
      if (local_12f4 == 0) {
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248,
                   (char (*) [26])0x30cff8,&local_12f0);
      }
      else {
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248,
                   (char (*) [44])"buffer_reference, buffer_reference_align = ",&local_12f4,
                   (char (*) [10])0x30d008,&local_12f0);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1238) {
        operator_delete((void *)local_1248._0_8_);
      }
    }
    statement<char_const(&)[2]>(this,(char (*) [2])0x2f5d0c);
    this->indent = this->indent + 1;
    bVar3 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
    if (bVar3) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(pSVar5->member_name_cache)._M_h);
      sVar2 = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar2 != 0) {
        local_12d0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)(pSVar5->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        lVar18 = sVar2 << 2;
        uVar19 = 0;
        do {
          add_member_name(this,pSVar5,(uint32_t)uVar19);
          uVar1 = *(uint *)(local_12d0 + uVar19 * 4);
          local_1128 = (undefined1  [8])&local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"","");
          (*(this->super_Compiler)._vptr_Compiler[0x15])
                    (this,pSVar5,(ulong)uVar1,uVar19 & 0xffffffff,(string *)local_1128,0);
          if (local_1128 != (undefined1  [8])&local_1118) {
            operator_delete((void *)local_1128);
          }
          uVar19 = uVar19 + 1;
          lVar18 = lVar18 + -4;
        } while (lVar18 != 0);
      }
    }
    else {
      pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5,0);
      (*(this->super_Compiler)._vptr_Compiler[0x26])(local_1248,this,pSVar5,0);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128,(char (*) [7])" value",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248,
                 (char (*) [2])0x313c50);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1238) {
        operator_delete((void *)local_1248._0_8_);
      }
      if (local_1128 != (undefined1  [8])&local_1118) {
        operator_delete((void *)local_1128);
      }
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x2f08f5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
    operator_delete(local_12f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration && is_physical_pointer_to_buffer_block(type))
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else
	{
		buffer_name = type_to_glsl(type);
	}

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (is_physical_pointer_to_buffer_block(type))
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else
		{
			string packing_standard;
			if (type.basetype == SPIRType::Struct)
			{
				// The non-block type is embedded in a block, so we cannot use enhanced layouts :(
				packing_standard = buffer_to_packing_standard(type, true, false) + ", ";
			}
			else if (is_array(get_pointee_type(type)))
			{
				SPIRType wrap_type{OpTypeStruct};
				wrap_type.self = ir.increase_bound_by(1);
				wrap_type.member_types.push_back(get_pointee_type_id(type_id));
				ir.set_member_decoration(wrap_type.self, 0, DecorationOffset, 0);
				packing_standard = buffer_to_packing_standard(wrap_type, true, false) + ", ";
			}

			if (alignment)
				statement("layout(", packing_standard, "buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
			else
				statement("layout(", packing_standard, "buffer_reference) buffer ", buffer_name);
		}

		begin_scope();

		if (is_physical_pointer_to_buffer_block(type))
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type, 0), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}